

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Lms_ManPrepare(Lms_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Wrd_t *pVVar8;
  Vec_Str_t *pVVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  
  if (p->fLibConstr != 0) {
    __assert_fail("!p->fLibConstr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x184,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (p->vTruthPo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruthPo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x185,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  pVVar3 = p->vTtMem;
  iVar1 = pVVar3->nEntries;
  lVar12 = (long)iVar1 + 1;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar15 = (int)lVar12;
  iVar11 = 0x10;
  if (0xe < (ulong)(long)iVar1) {
    iVar11 = iVar15;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar11;
  if (iVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar11 << 2);
  }
  pVVar6->pArray = piVar7;
  pVVar6->nSize = iVar15;
  if (piVar7 != (int *)0x0) {
    memset(piVar7,0xff,lVar12 * 4);
  }
  p->vTruthPo = pVVar6;
  pVVar4 = p->vTruthIds;
  uVar2 = pVVar4->nSize;
  uVar10 = (ulong)uVar2;
  if (uVar10 == 0) {
    iVar11 = 0;
  }
  else {
    iVar11 = *pVVar4->pArray;
    if (1 < (int)uVar2) {
      uVar14 = 1;
      do {
        iVar15 = pVVar4->pArray[uVar14];
        if (iVar15 <= iVar11) {
          iVar11 = iVar15;
        }
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
  }
  if (iVar11 < 0) {
    __assert_fail("Vec_IntFindMin(p->vTruthIds) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x187,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (uVar10 == 0) {
    iVar11 = 0;
  }
  else {
    iVar11 = *pVVar4->pArray;
    if (1 < (int)uVar2) {
      uVar14 = 1;
      do {
        iVar15 = pVVar4->pArray[uVar14];
        if (iVar11 <= iVar15) {
          iVar11 = iVar15;
        }
        uVar14 = uVar14 + 1;
      } while (uVar10 != uVar14);
    }
  }
  if (pVVar3->nEntries <= iVar11) {
    __assert_fail("Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0x188,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (0 < pVVar4->nSize) {
    piVar5 = pVVar4->pArray;
    lVar12 = 0;
    do {
      lVar13 = (long)piVar5[lVar12];
      if ((lVar13 < 0) || (pVVar6->nSize <= piVar5[lVar12])) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (piVar7[lVar13] == -1) {
        piVar7[lVar13] = (int)lVar12;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar4->nSize);
  }
  iVar11 = pVVar3->nEntries;
  if ((-1 < (long)iVar11) && (iVar11 <= iVar1)) {
    p_00 = p->pGia;
    piVar7[iVar11] = p_00->vCos->nSize;
    if (p->vDelays != (Vec_Wrd_t *)0x0) {
      __assert_fail("p->vDelays == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,0x18e,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    if (p->vAreas != (Vec_Str_t *)0x0) {
      __assert_fail("p->vAreas == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,399,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    if (p->vFreqs != (Vec_Int_t *)0x0) {
      __assert_fail("p->vFreqs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                    ,400,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    pVVar8 = Lms_GiaDelays(p_00);
    p->vDelays = pVVar8;
    pVVar9 = Lms_GiaAreas(p->pGia);
    p->vAreas = pVVar9;
    iVar1 = p->pGia->vCos->nSize;
    pVVar6 = (Vec_Int_t *)malloc(0x10);
    iVar11 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar11 = iVar1;
    }
    pVVar6->nSize = 0;
    pVVar6->nCap = iVar11;
    if (iVar11 == 0) {
      piVar7 = (int *)0x0;
    }
    else {
      piVar7 = (int *)malloc((long)iVar11 << 2);
    }
    pVVar6->pArray = piVar7;
    pVVar6->nSize = iVar1;
    if (piVar7 != (int *)0x0) {
      memset(piVar7,0,(long)iVar1 << 2);
    }
    p->vFreqs = pVVar6;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Lms_ManPrepare( Lms_Man_t * p )
{
    // compute the first PO for each semi-canonical form
    int i, Entry;
    assert( !p->fLibConstr );
    assert( p->vTruthPo == NULL );
    p->vTruthPo = Vec_IntStartFull( Vec_MemEntryNum(p->vTtMem)+1 );
    assert( Vec_IntFindMin(p->vTruthIds) >= 0 );
    assert( Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem) );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
        if ( Vec_IntEntry(p->vTruthPo, Entry) == -1 )
            Vec_IntWriteEntry( p->vTruthPo, Entry, i );
    Vec_IntWriteEntry( p->vTruthPo, Vec_MemEntryNum(p->vTtMem), Gia_ManCoNum(p->pGia) );
    // compute delay/area and init frequency
    assert( p->vDelays == NULL );
    assert( p->vAreas == NULL );
    assert( p->vFreqs == NULL );
    p->vDelays = Lms_GiaDelays( p->pGia );
    p->vAreas  = Lms_GiaAreas( p->pGia );
    p->vFreqs  = Vec_IntStart( Gia_ManCoNum(p->pGia) );
}